

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O0

DatatypeValidator * __thiscall
xercesc_4_0::GrammarResolver::getDatatypeValidator
          (GrammarResolver *this,XMLCh *uriStr,XMLCh *localPartStr)

{
  bool bVar1;
  int iVar2;
  DatatypeValidatorFactory *pDVar3;
  XMLCh *dvType;
  undefined1 local_78 [8];
  XMLBuffer nameBuf;
  Grammar *grammar;
  DatatypeValidator *local_28;
  DatatypeValidator *dv;
  XMLCh *localPartStr_local;
  XMLCh *uriStr_local;
  GrammarResolver *this_local;
  
  local_28 = (DatatypeValidator *)0x0;
  bVar1 = XMLString::equals(uriStr,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  if (bVar1) {
    if (this->fDataTypeReg == (DatatypeValidatorFactory *)0x0) {
      pDVar3 = (DatatypeValidatorFactory *)XMemory::operator_new(0x18,this->fMemoryManager);
      DatatypeValidatorFactory::DatatypeValidatorFactory(pDVar3,this->fMemoryManager);
      this->fDataTypeReg = pDVar3;
    }
    local_28 = DatatypeValidatorFactory::getDatatypeValidator(this->fDataTypeReg,localPartStr);
  }
  else {
    nameBuf.fBuffer = (XMLCh *)getGrammar(this,uriStr);
    if (((Grammar *)nameBuf.fBuffer != (Grammar *)0x0) &&
       (iVar2 = (*(((Grammar *)nameBuf.fBuffer)->super_XSerializable)._vptr_XSerializable[5])(),
       iVar2 == 1)) {
      XMLBuffer::XMLBuffer((XMLBuffer *)local_78,0x80,this->fMemoryManager);
      XMLBuffer::set((XMLBuffer *)local_78,uriStr);
      XMLBuffer::append((XMLBuffer *)local_78,L',');
      XMLBuffer::append((XMLBuffer *)local_78,localPartStr);
      pDVar3 = SchemaGrammar::getDatatypeRegistry((SchemaGrammar *)nameBuf.fBuffer);
      dvType = XMLBuffer::getRawBuffer((XMLBuffer *)local_78);
      local_28 = DatatypeValidatorFactory::getDatatypeValidator(pDVar3,dvType);
      XMLBuffer::~XMLBuffer((XMLBuffer *)local_78);
    }
  }
  return local_28;
}

Assistant:

DatatypeValidator*
GrammarResolver::getDatatypeValidator(const XMLCh* const uriStr,
                                      const XMLCh* const localPartStr) {

    DatatypeValidator* dv = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

        if (!fDataTypeReg) {

            fDataTypeReg = new (fMemoryManager) DatatypeValidatorFactory(fMemoryManager);
        }

        dv = fDataTypeReg->getDatatypeValidator(localPartStr);
    }
    else {

        Grammar* grammar = getGrammar(uriStr);

        if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType) {

            XMLBuffer nameBuf(128, fMemoryManager);

            nameBuf.set(uriStr);
            nameBuf.append(chComma);
            nameBuf.append(localPartStr);

            dv = ((SchemaGrammar*) grammar)->getDatatypeRegistry()->getDatatypeValidator(nameBuf.getRawBuffer());
        }
    }

    return dv;
}